

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

_Bool Curl_cpool_conn_now_idle(Curl_easy *data,connectdata *conn)

{
  cpool *cpool_00;
  connectdata *conn_00;
  bool bVar1;
  curltime cVar2;
  uint local_50;
  _Bool do_lock;
  undefined4 uStack_3c;
  _Bool local_31;
  _Bool kept;
  cpool *cpool;
  connectdata *oldest_idle;
  uint maxconnects;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  if (data->multi->maxconnects == 0) {
    local_50 = data->multi->num_easy << 2;
  }
  else {
    local_50 = data->multi->maxconnects;
  }
  cpool_00 = cpool_get_instance(data);
  local_31 = true;
  cVar2 = Curl_now();
  (conn->lastused).tv_sec = cVar2.tv_sec;
  *(ulong *)&(conn->lastused).tv_usec = CONCAT44(uStack_3c,cVar2.tv_usec);
  if ((cpool_00 != (cpool *)0x0) && (local_50 != 0)) {
    bVar1 = false;
    if (cpool_00 != (cpool *)0x0) {
      bVar1 = (cpool_00->field_0x98 & 1) != 0;
    }
    if (((bool)(bVar1 ^ 1U)) && (cpool_00 != (cpool *)0x0)) {
      if ((cpool_00->share != (Curl_share *)0x0) && ((cpool_00->share->specifier & 0x20) != 0)) {
        Curl_share_lock(cpool_00->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      cpool_00->field_0x98 = cpool_00->field_0x98 & 0xfe | 1;
    }
    if ((ulong)local_50 < cpool_00->num_conn) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"Connection pool is full, closing the oldest one");
      }
      conn_00 = cpool_get_oldest_idle(cpool_00);
      local_31 = conn_00 != conn;
      if (conn_00 != (connectdata *)0x0) {
        Curl_cpool_disconnect(cpool_00->idata,conn_00,false);
      }
    }
    if (((((bool)(bVar1 ^ 1U)) && (cpool_00 != (cpool *)0x0)) &&
        (cpool_00->field_0x98 = cpool_00->field_0x98 & 0xfe, cpool_00->share != (Curl_share *)0x0))
       && ((cpool_00->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool_00->idata,CURL_LOCK_DATA_CONNECT);
    }
  }
  return local_31;
}

Assistant:

bool Curl_cpool_conn_now_idle(struct Curl_easy *data,
                              struct connectdata *conn)
{
  unsigned int maxconnects = !data->multi->maxconnects ?
    data->multi->num_easy * 4 : data->multi->maxconnects;
  struct connectdata *oldest_idle = NULL;
  struct cpool *cpool = cpool_get_instance(data);
  bool kept = TRUE;

  conn->lastused = Curl_now(); /* it was used up until now */
  if(cpool && maxconnects) {
    /* may be called form a callback already under lock */
    bool do_lock = !CPOOL_IS_LOCKED(cpool);
    if(do_lock)
      CPOOL_LOCK(cpool);
    if(cpool->num_conn > maxconnects) {
      infof(data, "Connection pool is full, closing the oldest one");

      oldest_idle = cpool_get_oldest_idle(cpool);
      kept = (oldest_idle != conn);
      if(oldest_idle) {
        Curl_cpool_disconnect(cpool->idata, oldest_idle, FALSE);
      }
    }
    if(do_lock)
      CPOOL_UNLOCK(cpool);
  }

  return kept;
}